

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_set_auxdata(sqlite3_context *pCtx,int iArg,void *pAux,_func_void_void_ptr *xDelete)

{
  sqlite3 *db;
  void *pvVar1;
  _func_void_void_ptr *p_Var2;
  VdbeFunc *p;
  int iVar3;
  
  if (-1 < iArg) {
    p = pCtx->pVdbeFunc;
    if (p == (VdbeFunc *)0x0) {
      db = (pCtx->s).db;
      if (db->mallocFailed != '\0') goto LAB_0014df53;
      p = (VdbeFunc *)sqlite3DbMallocRaw(db,iArg * 0x10 + 0x20);
      iVar3 = 0;
    }
    else {
      iVar3 = p->nAux;
      if (iArg < iVar3) goto LAB_0014df22;
      p = (VdbeFunc *)sqlite3DbRealloc((pCtx->s).db,p,iArg * 0x10 + 0x20);
    }
    if (p != (VdbeFunc *)0x0) {
      pCtx->pVdbeFunc = p;
      memset(p->apAux + iVar3,0,(long)((iArg + 1) - iVar3) << 4);
      p->nAux = iArg + 1;
      p->pFunc = pCtx->pFunc;
LAB_0014df22:
      pvVar1 = p->apAux[(uint)iArg].pAux;
      if ((pvVar1 != (void *)0x0) &&
         (p_Var2 = p->apAux[(uint)iArg].xDelete, p_Var2 != (_func_void_void_ptr *)0x0)) {
        (*p_Var2)(pvVar1);
      }
      p->apAux[(uint)iArg].pAux = pAux;
      p->apAux[(uint)iArg].xDelete = xDelete;
      return;
    }
  }
LAB_0014df53:
  if (xDelete == (_func_void_void_ptr *)0x0) {
    return;
  }
  (*xDelete)(pAux);
  return;
}

Assistant:

SQLITE_API void sqlite3_set_auxdata(
  sqlite3_context *pCtx, 
  int iArg, 
  void *pAux, 
  void (*xDelete)(void*)
){
  struct AuxData *pAuxData;
  VdbeFunc *pVdbeFunc;
  if( iArg<0 ) goto failed;

  assert( sqlite3_mutex_held(pCtx->s.db->mutex) );
  pVdbeFunc = pCtx->pVdbeFunc;
  if( !pVdbeFunc || pVdbeFunc->nAux<=iArg ){
    int nAux = (pVdbeFunc ? pVdbeFunc->nAux : 0);
    int nMalloc = sizeof(VdbeFunc) + sizeof(struct AuxData)*iArg;
    pVdbeFunc = sqlite3DbRealloc(pCtx->s.db, pVdbeFunc, nMalloc);
    if( !pVdbeFunc ){
      goto failed;
    }
    pCtx->pVdbeFunc = pVdbeFunc;
    memset(&pVdbeFunc->apAux[nAux], 0, sizeof(struct AuxData)*(iArg+1-nAux));
    pVdbeFunc->nAux = iArg+1;
    pVdbeFunc->pFunc = pCtx->pFunc;
  }

  pAuxData = &pVdbeFunc->apAux[iArg];
  if( pAuxData->pAux && pAuxData->xDelete ){
    pAuxData->xDelete(pAuxData->pAux);
  }
  pAuxData->pAux = pAux;
  pAuxData->xDelete = xDelete;
  return;

failed:
  if( xDelete ){
    xDelete(pAux);
  }
}